

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> __thiscall
Parser::parseUnaryExpr(Parser *this)

{
  TokenType tok;
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pcVar4;
  pointer pcVar5;
  FloatLit *this_00;
  pointer *__ptr_2;
  pointer *__ptr;
  Parser *in_RSI;
  TokenType op;
  unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> operand;
  vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
  args;
  string local_68;
  vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
  local_48;
  
  tok = (in_RSI->m_currToken).type;
  switch(tok) {
  case LeftParen:
    eatToken(in_RSI,LeftParen);
    parseOrExpr(this);
    eatToken(in_RSI,RightParen);
    return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
           (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
  default:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)0x0;
    return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
           (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
  case Ampersand:
  case Plus:
  case Minus:
  case Bang:
    eatToken(in_RSI,tok);
    parseUnaryExpr((Parser *)&local_68);
    pcVar4 = (pointer)operator_new(0x18);
    *(undefined ***)pcVar4 = &PTR__UnaryExpr_00182a88;
    *(TokenType *)(pcVar4 + 8) = tok;
    *(pointer *)(pcVar4 + 0x10) = local_68._M_dataplus._M_p;
    break;
  case String:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar4 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + (in_RSI->m_currToken).literal._M_string_length);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    this_00 = (FloatLit *)operator_new(0x28);
    (this_00->super_Expr).super_Stmt._vptr_Stmt = (_func_int **)&PTR__StringLit_00182ac8;
    this_00->m_value = (double)&this_00[1].m_value;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&this_00->m_value,local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    goto LAB_00133cc2;
  case Integer:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar4 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + (in_RSI->m_currToken).literal._M_string_length);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    this_00 = (FloatLit *)operator_new(0x10);
    AST::IntegerLit::IntegerLit((IntegerLit *)this_00,&local_68);
    goto LAB_00133cc2;
  case Float:
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    pcVar4 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + (in_RSI->m_currToken).literal._M_string_length);
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    this_00 = (FloatLit *)operator_new(0x10);
    AST::FloatLit::FloatLit(this_00,&local_68);
LAB_00133cc2:
    (this->m_lexer).m_input._M_dataplus._M_p = (pointer)this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
             (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
    }
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
           (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
  case True:
    eatToken(in_RSI,True);
    pcVar4 = (pointer)operator_new(0x10);
    *(undefined ***)pcVar4 = &PTR__Stmt_00182b88;
    pcVar4[8] = '\x01';
    break;
  case False:
    eatToken(in_RSI,False);
    pcVar4 = (pointer)operator_new(0x10);
    *(undefined ***)pcVar4 = &PTR__Stmt_00182b88;
    pcVar4[8] = '\0';
    break;
  case Identifier:
    pcVar5 = (pointer)operator_new(0x28);
    pcVar4 = (in_RSI->m_currToken).literal._M_dataplus._M_p;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,pcVar4,pcVar4 + (in_RSI->m_currToken).literal._M_string_length);
    *(undefined ***)pcVar5 = &PTR__Identifier_001827b0;
    *(pointer *)(pcVar5 + 8) = pcVar5 + 0x18;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pcVar5 + 8),local_68._M_dataplus._M_p,
               local_68._M_dataplus._M_p + local_68._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    eatToken(in_RSI,(in_RSI->m_currToken).type);
    if ((in_RSI->m_currToken).type == LeftParen) {
      local_48.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      eatToken(in_RSI,LeftParen);
      if ((in_RSI->m_currToken).type != RightParen) {
        do {
          parseOrExpr((Parser *)&local_68);
          if ((in_RSI->m_currToken).type != RightParen) {
            eatToken(in_RSI,Comma);
          }
          std::
          vector<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::allocator<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>>
          ::emplace_back<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>
                    ((vector<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>,std::allocator<std::unique_ptr<AST::Expr,std::default_delete<AST::Expr>>>>
                      *)&local_48,
                     (unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_> *)&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_68._M_dataplus._M_p + 8))();
          }
        } while ((in_RSI->m_currToken).type != RightParen);
      }
      eatToken(in_RSI,RightParen);
      pcVar4 = (pointer)operator_new(0x28);
      puVar3 = local_48.
               super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      puVar2 = local_48.
               super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar1 = local_48.
               super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_48.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48.
      super__Vector_base<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(undefined ***)pcVar4 = &PTR__FnCall_00182bc8;
      *(pointer *)(pcVar4 + 8) = pcVar5;
      *(pointer *)(pcVar4 + 0x10) = puVar1;
      *(pointer *)(pcVar4 + 0x18) = puVar2;
      *(pointer *)(pcVar4 + 0x20) = puVar3;
      local_68.field_2._M_allocated_capacity = 0;
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      std::
      vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ::~vector((vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
                 *)&local_68);
      (this->m_lexer).m_input._M_dataplus._M_p = pcVar4;
      std::
      vector<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>,_std::allocator<std::unique_ptr<AST::Expr,_std::default_delete<AST::Expr>_>_>_>
      ::~vector(&local_48);
      return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
             (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
    }
    (this->m_lexer).m_input._M_dataplus._M_p = pcVar5;
    return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
           (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
  }
  (this->m_lexer).m_input._M_dataplus._M_p = pcVar4;
  return (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)
         (__uniq_ptr_data<AST::Expr,_std::default_delete<AST::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<AST::Expr> Parser::parseUnaryExpr() {
    if (m_currToken.type == TokenType::Plus ||
        m_currToken.type == TokenType::Minus ||
        m_currToken.type == TokenType::Bang ||
        m_currToken.type == TokenType::Ampersand) {
        TokenType op = m_currToken.type;
        eatToken(m_currToken.type);
        auto operand = parseUnaryExpr();
        return std::make_unique<AST::UnaryExpr>(op,
                                                std::move(operand));
    } else if (m_currToken.type == TokenType::LeftParen) {
        eatToken(m_currToken.type);
        auto expr = parseExpr();
        eatToken(TokenType::RightParen);
        return expr;
    } else if (m_currToken.type == TokenType::String) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::StringLit>(lit);
    } else if (m_currToken.type == TokenType::Integer) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::IntegerLit>(lit);
    } else if (m_currToken.type == TokenType::Float) {
        std::string lit = m_currToken.literal;
        eatToken(m_currToken.type);
        return std::make_unique<AST::FloatLit>(lit);
    } else if (m_currToken.type == TokenType::True) {
        eatToken(m_currToken.type);
        return std::make_unique<AST::BooleanLit>(true);
    } else if (m_currToken.type == TokenType::False) {
        eatToken(m_currToken.type);
        return std::make_unique<AST::BooleanLit>(false);
    } else if (m_currToken.type == TokenType::Identifier) {
        auto id = std::make_unique<AST::Identifier>(m_currToken.literal);
        eatToken(m_currToken.type);
        if (m_currToken.type == TokenType::LeftParen) {
            // function call
            std::vector<std::unique_ptr<AST::Expr>> args;
            eatToken(m_currToken.type);
            while (m_currToken.type != TokenType::RightParen) {
                auto arg = parseExpr();
                if (m_currToken.type != TokenType::RightParen) {
                    eatToken(TokenType::Comma);
                }
                args.push_back(std::move(arg));
            }
            eatToken(TokenType::RightParen);
            return std::make_unique<AST::FnCall>(std::move(id), std::move(args));
        }
        return static_cast<std::unique_ptr<AST::Expr>>(std::move(id));
    }
    return nullptr;
}